

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScenePrivate::updateFont(QGraphicsScenePrivate *this,QFont *font)

{
  QObject *pQVar1;
  long *plVar2;
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *pQVar3;
  int *piVar4;
  long lVar5;
  QGraphicsItem *pQVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  QFont::operator=(&this->font,font);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  plVar2 = *(long **)(*(long *)(pQVar1 + 8) + 0x88);
  (**(code **)(*plVar2 + 0x60))(&local_58,plVar2,1);
  if (local_48 != (undefined1 *)0x0) {
    lVar5 = CONCAT44(uStack_4c,uStack_50);
    lVar8 = (long)local_48 << 3;
    lVar7 = 0;
    do {
      this_00 = *(QGraphicsItem **)(lVar5 + lVar7);
      pQVar6 = QGraphicsItem::parentItem(this_00);
      if (pQVar6 == (QGraphicsItem *)0x0) {
        pQVar3 = (this_00->d_ptr).d;
        (*pQVar3->_vptr_QGraphicsItemPrivate[5])(pQVar3,(ulong)*(uint *)(font + 8));
      }
      lVar7 = lVar7 + 8;
    } while (lVar8 != lVar7);
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_68,FontChange);
  QCoreApplication::sendEvent(pQVar1,(QEvent *)&local_68);
  QEvent::~QEvent((QEvent *)&local_68);
  piVar4 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::updateFont(const QFont &font)
{
    Q_Q(QGraphicsScene);

    // Update local font setting.
    this->font = font;

    // Resolve the fonts of all top-level widget items, or widget items
    // whose parent is not a widget.
    const auto items = q->items();
    for (QGraphicsItem *item : items) {
        if (!item->parentItem()) {
            // Resolvefont for an item is a noop operation, but
            // every item can be a widget, or can have a widget
            // childre.
            item->d_ptr->resolveFont(font.resolveMask());
        }
    }

    // Send the scene a FontChange event.
    QEvent event(QEvent::FontChange);
    QCoreApplication::sendEvent(q, &event);
}